

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

int __thiscall
CVmObjGramProd::getp_parse(CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  CVmObjPageEntry *pCVar4;
  anon_union_8_8_cb74652f_for_val aVar5;
  undefined4 uVar6;
  vm_val_t *pvVar7;
  vm_val_t *pvVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  vm_obj_id_t vVar12;
  ulong tok_cnt;
  vmgramprod_tok *tok;
  ulong uVar13;
  ushort *puVar14;
  void *__dest;
  CVmGramProdMatchEntry *pCVar15;
  long lVar16;
  size_t sVar17;
  size_t idx;
  uint uVar18;
  vm_val_t *this_00;
  CVmGramProdMatchEntry *pCVar19;
  CVmObjPageEntry *local_c0;
  vm_val_t tok_typ_val;
  enum_props_ctx ctx;
  vm_val_t tok_str_val;
  CVmGramProdQueue queues;
  vm_val_t ele_val;
  
  if (argc == (uint *)0x0) {
    uVar18 = 0;
  }
  else {
    uVar18 = *argc;
  }
  if ((getp_parse(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar9 = __cxa_guard_acquire(&getp_parse(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar9 != 0)) {
    getp_parse::desc.min_argc_ = 2;
    getp_parse::desc.opt_argc_ = 0;
    getp_parse::desc.varargs_ = 0;
    __cxa_guard_release(&getp_parse(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar9 = CVmObject::get_prop_check_argc(retval,argc,&getp_parse::desc);
  if (iVar9 != 0) {
    return 1;
  }
  plVar2 = *(long **)((this->super_CVmObject).ext_ + 0x18);
  lVar3 = *plVar2;
  lVar16 = lVar3 + 8;
  if (lVar3 == 0) {
    lVar16 = 0;
  }
  plVar2[1] = lVar3;
  plVar2[3] = (ulong)(lVar3 != 0) << 0xe;
  plVar2[2] = lVar16;
  queues.success_list_ = (CVmGramProdMatchEntry *)0x0;
  queues.work_queue_ = (CVmGramProdState *)0x0;
  queues.badness_queue_ = (CVmGramProdState *)0x0;
  this_00 = sp_ + -1;
  iVar9 = vm_val_t::is_listlike(this_00);
  if ((iVar9 == 0) || (uVar10 = vm_val_t::ll_length(this_00), (int)uVar10 < 0)) {
    err_throw(0x7e4);
  }
  if (1 < (int)uVar18) {
    if ((sp_[-2].typ & ~VM_CODEPTR) != VM_NIL) {
      err_throw(0x7da);
    }
    if (sp_[-2].typ != VM_NIL) {
      vVar12 = sp_[-2].val.obj;
      iVar9 = CVmObjDict::is_dictionary_obj(vVar12);
      if (iVar9 == 0) {
        err_throw(0x7e6);
      }
      local_c0 = G_obj_table_X.pages_[vVar12 >> 0xc] + (vVar12 & 0xfff);
      goto LAB_00254b0d;
    }
  }
  local_c0 = (CVmObjPageEntry *)0x0;
LAB_00254b0d:
  iVar9 = 1;
  tok_cnt = (ulong)uVar10;
  tok = (vmgramprod_tok *)
        CVmGramProdMem::alloc
                  (*(CVmGramProdMem **)((this->super_CVmObject).ext_ + 0x18),tok_cnt << 6);
  sVar17 = 0;
  while( true ) {
    if (tok_cnt << 6 == sVar17) {
      sVar17 = 0;
      enqueue_alts(this,*(CVmGramProdMem **)((this->super_CVmObject).ext_ + 0x18),tok,tok_cnt,0,
                   (CVmGramProdState *)0x0,&queues,self,0,(CVmGramProdMatch *)0x0,
                   (CVmObjDict *)local_c0);
      process_work_queue(*(CVmGramProdMem **)((this->super_CVmObject).ext_ + 0x18),tok,tok_cnt,
                         &queues,(CVmObjDict *)local_c0);
      pCVar19 = queues.success_list_;
      for (pCVar15 = queues.success_list_; pCVar15 != (CVmGramProdMatchEntry *)0x0;
          pCVar15 = pCVar15->nxt_) {
        sVar17 = sVar17 + 1;
      }
      idx = 0;
      vVar12 = CVmObjList::create(0,sVar17);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar12;
      pCVar4 = G_obj_table_X.pages_[vVar12 >> 0xc];
      CVmObjList::cons_clear((CVmObjList *)(pCVar4 + (vVar12 & 0xfff)));
      pvVar7 = sp_;
      uVar6 = *(undefined4 *)&retval->field_0x4;
      aVar5 = retval->val;
      sp_ = sp_ + 1;
      pvVar7->typ = retval->typ;
      *(undefined4 *)&pvVar7->field_0x4 = uVar6;
      pvVar7->val = aVar5;
      for (; pCVar19 != (CVmGramProdMatchEntry *)0x0; pCVar19 = pCVar19->nxt_) {
        tok_typ_val.val.obj = CVmObjList::create(0,pCVar19->tok_pos_);
        pvVar7 = sp_;
        tok_typ_val.typ = VM_OBJ;
        aVar5._4_4_ = tok_typ_val.val._4_4_;
        aVar5.obj = tok_typ_val.val.obj;
        pvVar8 = sp_ + 1;
        *(ulong *)sp_ = CONCAT44(tok_typ_val._4_4_,5);
        sp_ = pvVar8;
        pvVar7->val = aVar5;
        CVmObjList::cons_clear
                  ((CVmObjList *)
                   (G_obj_table_X.pages_[tok_typ_val.val.obj >> 0xc] + (tok_typ_val.val.obj & 0xfff)
                   ));
        build_match_tree(pCVar19->match_,this_00,&tok_typ_val,&ele_val,(size_t *)&tok_str_val,
                         (size_t *)&ctx);
        sp_ = sp_ + -1;
        CVmObjList::cons_set_element((CVmObjList *)(pCVar4 + (vVar12 & 0xfff)),idx,&ele_val);
        idx = idx + 1;
      }
      sp_ = sp_ + (-1 - (long)(int)uVar18);
      return 1;
    }
    puVar1 = (undefined8 *)((long)&tok->match_cnt_ + sVar17);
    *puVar1 = 0;
    puVar1[1] = 0;
    vm_val_t::ll_index(this_00,&ele_val,iVar9);
    iVar11 = vm_val_t::is_listlike(&ele_val);
    if ((iVar11 == 0) || (iVar11 = vm_val_t::ll_length(&ele_val), iVar11 < 0)) break;
    vm_val_t::ll_index(&ele_val,&tok_str_val,1);
    vm_val_t::ll_index(&ele_val,&tok_typ_val,2);
    uVar13 = (ulong)tok_typ_val.val.obj;
    if (tok_typ_val.typ != VM_ENUM) {
      uVar13 = 0;
    }
    *(ulong *)((long)&tok->typ_ + sVar17) = uVar13;
    puVar14 = (ushort *)vm_val_t::get_as_string(&tok_str_val);
    if (puVar14 == (ushort *)0x0) {
      puVar1 = (undefined8 *)((long)&tok->txt_ + sVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    else {
      puVar1 = (undefined8 *)((long)&(tok->val_).typ + sVar17);
      *puVar1 = tok_str_val._0_8_;
      *(anon_union_8_8_cb74652f_for_val *)(puVar1 + 1) = tok_str_val.val;
      *(ushort **)((long)&tok->txt_ + sVar17) = puVar14 + 1;
      *(ulong *)((long)&tok->len_ + sVar17) = (ulong)*puVar14;
      uVar10 = calc_str_hash((CVmObjDict *)local_c0,&tok_str_val,(char *)(puVar14 + 1),
                             (ulong)*puVar14);
      *(uint *)((long)&tok->hash_ + sVar17) = uVar10;
      if (local_c0 != (CVmObjPageEntry *)0x0) {
        ctx.ext = (vm_gram_ext *)(this->super_CVmObject).ext_;
        ctx.cnt = 0;
        CVmObjDict::enum_word_props
                  ((CVmObjDict *)local_c0,enum_props_cb,&ctx,&tok_str_val,
                   *(char **)((long)&tok->txt_ + sVar17),*(size_t *)((long)&tok->len_ + sVar17));
        if (ctx.cnt != 0) {
          *(size_t *)((long)&tok->match_cnt_ + sVar17) = ctx.cnt;
          __dest = CVmGramProdMem::alloc
                             (*(CVmGramProdMem **)((this->super_CVmObject).ext_ + 0x18),ctx.cnt * 2)
          ;
          *(void **)((long)&tok->matches_ + sVar17) = __dest;
          memcpy(__dest,*(void **)((this->super_CVmObject).ext_ + 0x20),ctx.cnt * 2);
        }
      }
    }
    sVar17 = sVar17 + 0x40;
    iVar9 = iVar9 + 1;
  }
  err_throw(0x900);
}

Assistant:

int CVmObjGramProd::getp_parse(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc)
{
    vm_val_t *tokval;
    vm_val_t dictval;
    CVmObjDict *dict;
    int tok_cnt;
    int i;
    vmgramprod_tok *tok;
    int orig_argc = (argc != 0 ? *argc : 0);
    CVmGramProdQueue queues;
    CVmObjList *lst;
    int succ_cnt;
    CVmGramProdMatchEntry *match;
    static CVmNativeCodeDesc desc(2);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* reset our memory pool */
    get_ext()->mem_->reset();

    /* clear the work queues */
    queues.clear();

    /* 
     *   get the tokenList argument and make sure it's a list; leave it on
     *   the stack for now so it remains reachable for the garbage
     *   collector 
     */
    tokval = G_stk->get(0);
    if (!tokval->is_listlike(vmg0_)
        || (tok_cnt = tokval->ll_length(vmg0_)) < 0)
        err_throw(VMERR_LIST_VAL_REQD);

    /* check for a dictionary argument */
    if (orig_argc >= 2)
    {
        /* get the dictionary argument */
        dictval = *G_stk->get(1);

        /* make sure it's an object or nil */
        if (dictval.typ != VM_OBJ && dictval.typ != VM_NIL)
            err_throw(VMERR_OBJ_VAL_REQD);
    }
    else
    {
        /* use a nil dictionary by default */
        dictval.set_nil();
    }

    /* get the dictionary object and check that it's really a dictionary */
    if (dictval.typ != VM_NIL)
    {
        /* if it's not a CVmObjDict object, it's the wrong type */
        if (!CVmObjDict::is_dictionary_obj(vmg_ dictval.val.obj))
        {
            /* wrong type - throw an error */
            err_throw(VMERR_INVAL_OBJ_TYPE);
        }

        /* get the VM object pointer */
        dict = (CVmObjDict *)vm_objp(vmg_ dictval.val.obj);
    }
    else
    {
        /* there's no dictionary object */
        dict = 0;
    }

    /* 
     *   For quick and easy access, make our own private copy of the token
     *   and type lists.  First, allocate an array of token structures.  
     */
    tok = (vmgramprod_tok *)get_ext()->mem_
          ->alloc(tok_cnt * sizeof(vmgramprod_tok));

    /* copy the token string references and types into our list */
    for (i = 0 ; i < tok_cnt ; ++i)
    {
        vm_val_t ele_val;
        vm_val_t tok_typ_val;
        vm_val_t tok_str_val;
        int subcnt;
        const char *tokstrp;

        /* presume we won't have any vocabulary properties for the word */
        tok[i].match_cnt_ = 0;
        tok[i].matches_ = 0;

        /* get this element from the list, and treat it as a list */
        tokval->ll_index(vmg_ &ele_val, i + 1);

        /* make sure the sub-val is a list */
        if (!ele_val.is_listlike(vmg0_)
            || (subcnt = ele_val.ll_length(vmg0_)) < 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* 
         *   parse the token sublist: the first element is the token value,
         *   and the second element is the token type 
         */
        ele_val.ll_index(vmg_ &tok_str_val, 1);
        ele_val.ll_index(vmg_ &tok_typ_val, 2);

        /* use the value if it's an enumerator; if not, use zero */
        if (tok_typ_val.typ == VM_ENUM)
            tok[i].typ_ = tok_typ_val.val.enumval;
        else
            tok[i].typ_ = 0;

        /* get the token value as a string */
        tokstrp = tok_str_val.get_as_string(vmg0_);

        /* if it's a string, copy it; otherwise, ignore the value */
        if (tokstrp != 0)
        {
            /* remember the string value */
            tok[i].val_ = tok_str_val;

            /* point the token to the string */
            tok[i].txt_ = tokstrp + VMB_LEN;
            tok[i].len_ = vmb_get_len(tokstrp);

            /* calculate and store the token's hash value */
            tok[i].hash_ = calc_str_hash(
                vmg_ dict, &tok_str_val,
                tokstrp + VMB_LEN, vmb_get_len(tokstrp));
            
            /* 
             *   if we have a dictionary, enumerate the properties
             *   associated with the word 
             */
            if (dict != 0)
            {
                enum_props_ctx ctx;
                
                /* set up our callback context */
                ctx.ext = get_ext();
                ctx.cnt = 0;
                
                /* enumerate the properties */
                dict->enum_word_props(vmg_ &enum_props_cb, &ctx,
                                      &tok_str_val, tok[i].txt_, tok[i].len_);
                
                /* 
                 *   if we found any properties for the word, make a copy
                 *   for the token list 
                 */
                if (ctx.cnt != 0)
                {
                    /* allocate space for the list */
                    tok[i].match_cnt_ = ctx.cnt;
                    tok[i].matches_ =
                        (vmgram_match_info *)get_ext()->mem_
                        ->alloc(ctx.cnt * sizeof(vmgram_match_info));
                    
                    /* copy the list */
                    memcpy(tok[i].matches_, get_ext()->prop_enum_arr_,
                           ctx.cnt * sizeof(tok[i].matches_[0]));
                }
            }
        }
        else
        {
            /* it's not a string - use a null string value for this token */
            tok[i].txt_ = 0;
            tok[i].len_ = 0;
        }
    }

    /* enqueue a match state item for each of our alternatives */
    enqueue_alts(vmg_ get_ext()->mem_, tok, tok_cnt, 0, 0,
                 &queues, self, FALSE, 0, dict);

    /* process the work queue */
    process_work_queue(vmg_ get_ext()->mem_, tok, tok_cnt,
                       &queues, dict);

    /* count the entries in the success list */
    for (succ_cnt = 0, match = queues.success_list_ ; match != 0 ;
         ++succ_cnt, match = match->nxt_) ;

    /* allocate the return list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, succ_cnt));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* initially clear the elements of the return list to nil */
    lst->cons_clear();

    /* push the list momentarily to protect it from garbage collection */
    G_stk->push(retval);

    /* set the elements */
    for (succ_cnt = 0, match = queues.success_list_ ; match != 0 ;
         ++succ_cnt, match = match->nxt_)
    {
        vm_val_t tree_val;
        vm_val_t tok_match_val;
        size_t first_tok;
        size_t last_tok;
        
        /* 
         *   Create a list to hold the token match list - this is a list of
         *   the dictionary's comparator's matchValue() results for the
         *   tokens that matched literals in the grammar rule.  We need a
         *   list with one element per token that we matched.
         *   
         *   We can't actually populate this list yet, but all we need for
         *   the moment are references to it.  So, create the list; we'll
         *   fill it in as we traverse the match to build the result tree.  
         */
        tok_match_val.set_obj(
            CVmObjList::create(vmg_ FALSE, match->tok_pos_));

        /* push the token match value list for gc protection */
        G_stk->push(&tok_match_val);

        /* clear it out */
        ((CVmObjList *)vm_objp(vmg_ tok_match_val.val.obj))->cons_clear();

        /* build the object tree for this success object */
        build_match_tree(vmg_ match->match_, tokval, &tok_match_val,
                         &tree_val, &first_tok, &last_tok);

        /* discard our token match list's gc protection stack entry */
        G_stk->discard();

        /* 
         *   add the match tree's root object to the main return list (note
         *   that this protects it from garbage collection by virtue of the
         *   main return list being protected from garbage collection) 
         */
        lst->cons_set_element(succ_cnt, &tree_val);
    }

    /* discard the gc protection */
    G_stk->discard();

    /* discard arguments */
    G_stk->discard(orig_argc);

    /* evaluation successful */
    return TRUE;
}